

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O3

void * heap_alloc(heap_t *heap,size_t size)

{
  heap_chunk_t *phVar1;
  heap_chunk_t *phVar2;
  size_t sVar3;
  ulong uVar4;
  
  uVar4 = size + 7 & 0xfffffffffffffff8;
  phVar1 = heap->chunk;
  if ((phVar1 == (heap_chunk_t *)0x0) ||
     (sVar3 = heap->size, phVar2 = phVar1, 0x1000 < sVar3 + uVar4)) {
    phVar2 = (heap_chunk_t *)malloc(0x1008);
    phVar2->next = phVar1;
    heap->chunk = phVar2;
    sVar3 = 0;
  }
  heap->size = uVar4 + sVar3;
  return (void *)((long)&phVar2[1].next + sVar3);
}

Assistant:

static void* heap_alloc(heap_t* heap, size_t size)
{
    size = ALIGN_SIZE(size);
    if(heap->chunk == NULL || heap->size + size > CHUNK_SIZE) {
        heap_chunk_t* chunk = malloc(CHUNK_SIZE + sizeof(heap_chunk_t));
        chunk->next = heap->chunk;
        heap->chunk = chunk;
        heap->size = 0;
    }

    void* data = (char*)(heap->chunk) + sizeof(heap_chunk_t) + heap->size;
    heap->size += size;
    return data;
}